

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void scroll_page_inter_command_start
               (Am_Object *command,bool vertical,Am_Object *ref_obj,int mousex,int mousey)

{
  Am_Object_Method_Type *pAVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  long lVar5;
  long val_1;
  long val_2;
  long target_val_1;
  long target_val_2;
  Am_Wrapper *value;
  undefined7 in_register_00000031;
  float fVar6;
  Am_Object scrollbar;
  Am_Value cur_value;
  Am_Value val2;
  Am_Object animator;
  Am_Object indicator;
  Am_Value val1;
  Am_Object scroll_command;
  Am_Object inter;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  undefined4 local_64;
  int local_60;
  int local_5c;
  int y;
  int x;
  Am_Value *local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  pAVar1 = save_pos_for_undo.Call;
  local_64 = (undefined4)CONCAT71(in_register_00000031,vertical);
  local_60 = mousex;
  local_5c = mousey;
  Am_Object::Am_Object(&local_48,command);
  (*pAVar1)((Am_Object_Data *)&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)command);
  bVar2 = Am_Object::Valid(&inter);
  if (!bVar2) goto LAB_0024d3bd;
  Am_Object::Get_Owner(&scrollbar,(Am_Slot_Flags)&inter);
  bVar2 = Am_Object::Valid(&scrollbar);
  if (bVar2) {
    scroll_command.data = (Am_Object_Data *)0x0;
    pAVar4 = Am_Object::Get(&scrollbar,0xc5,0);
    Am_Object::operator=(&scroll_command,pAVar4);
    cur_value.type = 0;
    cur_value.value.wrapper_value = (Am_Wrapper *)0x0;
    val1.type = 0;
    val1.value.wrapper_value = (Am_Wrapper *)0x0;
    val2.type = 0;
    val2.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar4 = Am_Object::Get(&scrollbar,0x181,1);
    local_50 = &val1;
    Am_Value::operator=(local_50,pAVar4);
    pAVar4 = Am_Object::Get(&scrollbar,0x182,1);
    Am_Value::operator=(&val2,pAVar4);
    pAVar4 = Am_Object::Get(&scrollbar,0x169,1);
    Am_Value::operator=(&cur_value,pAVar4);
    if ((val1.type == 2) && (val2.type == 2)) {
      lVar5 = Am_Value::operator_cast_to_long(&cur_value);
      val_1 = Am_Value::operator_cast_to_long(&val1);
      val_2 = Am_Value::operator_cast_to_long(&val2);
      target_val_1 = Am_Value::operator_cast_to_long(&val1);
      target_val_2 = Am_Value::operator_cast_to_long(&val2);
      lVar5 = Am_Clip_And_Map(lVar5,val_1,val_2,target_val_1,target_val_2);
      Am_Value::operator=(&cur_value,lVar5);
    }
    else {
      local_68 = Am_Value::operator_cast_to_float(&cur_value);
      local_6c = Am_Value::operator_cast_to_float(&val1);
      local_70 = Am_Value::operator_cast_to_float(&val2);
      local_74 = Am_Value::operator_cast_to_float(&val1);
      fVar6 = Am_Value::operator_cast_to_float(&val2);
      fVar6 = Am_Clip_And_Map(local_68,local_6c,local_70,local_74,fVar6);
      Am_Value::operator=(&cur_value,fVar6);
    }
    Am_Object::Set(&scrollbar,0x169,&cur_value,0);
    Am_Object::Get_Object(&indicator,(Am_Slot_Key)&scrollbar,0x1b7);
    bVar2 = Am_Translate_Coordinates(ref_obj,local_60,local_5c,&scrollbar,&x,&y);
    if (bVar2) {
      if ((char)local_64 == '\0') {
        pAVar4 = Am_Object::Get(&indicator,100,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar3 <= x) goto LAB_0024d248;
      }
      else {
        pAVar4 = Am_Object::Get(&indicator,0x65,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar3 <= y) goto LAB_0024d248;
      }
    }
    else {
LAB_0024d248:
      local_50 = &val2;
    }
    Am_Value::operator=(&cur_value,local_50);
    Am_Object::Am_Object(&local_80,&scrollbar);
    Am_Get_Animator(&animator,(Am_Slot_Key)&local_80);
    Am_Object::~Am_Object(&local_80);
    pAVar4 = Am_Object::Get(&scrollbar,0x184,0);
    Am_Object::Set(&animator,0x183,pAVar4,0);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
    Am_Object::Set(&animator,0x1ac,value,0);
    Am_Object::Set(&scrollbar,0x169,&cur_value,0x40000);
    Am_Value::Am_Value(&local_40,&cur_value);
    Am_Object::Am_Object(&local_88,&scrollbar);
    Am_Object::Am_Object(&local_90,&scroll_command);
    Am_Object::Am_Object(&local_98,command);
    set_scrollbar_and_commands(&local_40,&local_88,&local_90,&local_98,false);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_88);
    Am_Value::~Am_Value(&local_40);
    Am_Object::~Am_Object(&animator);
    Am_Object::~Am_Object(&indicator);
    Am_Value::~Am_Value(&val2);
    Am_Value::~Am_Value(&val1);
    Am_Value::~Am_Value(&cur_value);
    Am_Object::~Am_Object(&scroll_command);
  }
  Am_Object::~Am_Object(&scrollbar);
LAB_0024d3bd:
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

void
scroll_page_inter_command_start(Am_Object command, bool vertical,
                                Am_Object ref_obj, int mousex, int mousey)
{
  save_pos_for_undo.Call(command);

  Am_Object inter = command.Get_Owner();
  if (inter.Valid()) {
    Am_Object scrollbar = inter.Get_Owner();
    if (scrollbar.Valid()) {
      Am_Object scroll_command;
      scroll_command = scrollbar.Get(Am_COMMAND);

      Am_Value cur_value, val1, val2;
      val1 = scrollbar.Peek(Am_VALUE_1);
      val2 = scrollbar.Peek(Am_VALUE_2);
      cur_value = scrollbar.Peek(Am_VALUE);

      // clip cur_value inside val1 and val2
      if (val1.type == Am_INT && val2.type == Am_INT) {
        cur_value = Am_Clip_And_Map((long)cur_value, (long)val1, (long)val2,
                                    (long)val1, (long)val2);
      } else { // calc in float
        cur_value = Am_Clip_And_Map((float)cur_value, (float)val1, (float)val2,
                                    (float)val1, (float)val2);
      }
      scrollbar.Set(Am_VALUE, cur_value);

      // choose the appropriate target value,
      // based on whether click is above the indicator
      bool towards_val1 = false;
      Am_Object indicator = scrollbar.Get_Object(Am_SCROLL_INDICATOR);
      int indicator_pos, x, y;
      if (Am_Translate_Coordinates(ref_obj, mousex, mousey, scrollbar, x, y)) {
        if (vertical) {
          indicator_pos = indicator.Get(Am_TOP);
          if (indicator_pos > y)
            towards_val1 = true;
        } else { //horizontal
          indicator_pos = indicator.Get(Am_LEFT);
          if (indicator_pos > x)
            towards_val1 = true;
        }
      }
      if (towards_val1)
        cur_value = val1;
      else
        cur_value = val2;

      // set up the animation
      Am_Object animator = Am_Get_Animator(scrollbar, Am_VALUE);
      animator.Set(Am_SMALL_INCREMENT, scrollbar.Get(Am_LARGE_INCREMENT));
      animator.Set(Am_INTERACTOR, inter);

      // trigger the animation
      scrollbar.Set(Am_VALUE, cur_value, Am_WITH_ANIMATION);
      set_scrollbar_and_commands(cur_value, scrollbar, scroll_command, command,
                                 false);
    }
  }
}